

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmFGeneric<(moira::Instr)200,(moira::Mode)9,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)9,_4> result;
  
  uVar1 = dasmIncRead<2>(this,addr);
  if ((uVar1 >> 0xe & 1) == 0) {
    pSVar2 = StrWriter::operator<<(str);
    StrWriter::operator<<(pSVar2,(Ffmt)0x2);
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar2,(Fp)(uVar1 >> 10 & 7));
  }
  else {
    pSVar2 = StrWriter::operator<<(str);
    StrWriter::operator<<(pSVar2,(Ffmt)(uVar1 >> 10 & 7));
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    result.pc = *addr;
    result.reg = op & 7;
    result.ext1 = dasmIncRead<2>(this,addr);
    StrWriter::operator<<(pSVar2,&result);
  }
  StrWriter::operator<<(str);
  StrWriter::operator<<(str,(Fp)(uVar1 >> 7 & 7));
  return;
}

Assistant:

void
Moira::dasmFGeneric(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);

    if (ext & 0x4000) {

        if (M == Mode::IM) {

            u64 val;

            switch (src) {

                case 0: // Long-Word Integer

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Long>(u32(val));
                    break;

                case 1: // Single precision

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 2: // Double precision
                case 3: // Packed-Decimal Real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr); // Why???
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 5: // Double-precision real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 6: // Byte Integer
                    val = dasmIncRead<Word>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Byte>(u32(val));
                    break;

                default:
                    str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Word>(reg, addr);
            }
        } else {
            str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Long>(reg, addr);
        }

    } else {
        str << Ins<I>{} << Ffmt{2} << str.tab << Fp{src};
    }

    str << Sep{} << Fp{dst};
}